

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_both.cc
# Opt level: O0

bool __thiscall bssl::tls_append_handshake_data(bssl *this,SSL *ssl,Span<const_unsigned_char> data)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  BUF_MEM *__p;
  pointer buf;
  uchar *in;
  size_t len;
  bool local_29;
  SSL *ssl_local;
  Span<const_unsigned_char> data_local;
  
  data_local.data_ = data.data_;
  ssl_local = ssl;
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)(*(long *)(this + 0x30) + 0xe0));
  if (!bVar2) {
    lVar1 = *(long *)(this + 0x30);
    __p = BUF_MEM_new();
    std::unique_ptr<buf_mem_st,_bssl::internal::Deleter>::reset
              ((unique_ptr<buf_mem_st,_bssl::internal::Deleter> *)(lVar1 + 0xe0),(pointer)__p);
  }
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)(*(long *)(this + 0x30) + 0xe0));
  local_29 = false;
  if (bVar2) {
    buf = std::unique_ptr<buf_mem_st,_bssl::internal::Deleter>::get
                    ((unique_ptr<buf_mem_st,_bssl::internal::Deleter> *)
                     (*(long *)(this + 0x30) + 0xe0));
    in = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)&ssl_local);
    len = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&ssl_local);
    iVar3 = BUF_MEM_append(buf,in,len);
    local_29 = iVar3 != 0;
  }
  return local_29;
}

Assistant:

bool tls_append_handshake_data(SSL *ssl, Span<const uint8_t> data) {
  // Re-create the handshake buffer if needed.
  if (!ssl->s3->hs_buf) {
    ssl->s3->hs_buf.reset(BUF_MEM_new());
  }
  return ssl->s3->hs_buf &&
         BUF_MEM_append(ssl->s3->hs_buf.get(), data.data(), data.size());
}